

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsStatus.cpp
# Opt level: O3

string * highsStatusToString_abi_cxx11_(string *__return_storage_ptr__,HighsStatus status)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (status == kError) {
    pcVar2 = "Error";
    pcVar1 = "";
  }
  else if (status == kWarning) {
    pcVar2 = "Warning";
    pcVar1 = "";
  }
  else if (status == kOk) {
    pcVar2 = "OK";
    pcVar1 = "";
  }
  else {
    pcVar2 = "Unrecognised HiGHS status";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string highsStatusToString(HighsStatus status) {
  switch (status) {
    case HighsStatus::kOk:
      return "OK";
    case HighsStatus::kWarning:
      return "Warning";
    case HighsStatus::kError:
      return "Error";
    default:
      assert(1 == 0);
      return "Unrecognised HiGHS status";
  }
}